

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O2

CURLcode Curl_mime_set_subparts(curl_mimepart *part,curl_mime *subparts,int take_ownership)

{
  curl_mimepart *pcVar1;
  curl_mime *pcVar2;
  int iVar3;
  curl_mime *pcVar4;
  code *pcVar5;
  
  if (part == (curl_mimepart *)0x0) {
    return CURLE_BAD_FUNCTION_ARGUMENT;
  }
  if (((part->kind == MIMEKIND_MULTIPART) && ((curl_mime *)part->arg == subparts)) ||
     (cleanup_part_content(part), subparts == (curl_mime *)0x0)) {
    return CURLE_OK;
  }
  if (subparts->parent != (curl_mimepart *)0x0) {
    return CURLE_BAD_FUNCTION_ARGUMENT;
  }
  pcVar2 = part->parent;
  if (part->parent != (curl_mime *)0x0) {
    do {
      pcVar4 = pcVar2;
      pcVar1 = pcVar4->parent;
      if (pcVar1 == (curl_mimepart *)0x0) break;
      pcVar2 = pcVar1->parent;
    } while (pcVar2 != (curl_mime *)0x0);
    if (pcVar4 == subparts) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
  }
  iVar3 = mime_subparts_seek(subparts,0,0);
  if (iVar3 != 0) {
    return CURLE_SEND_FAIL_REWIND;
  }
  subparts->parent = part;
  part->seekfunc = mime_subparts_seek;
  pcVar5 = mime_subparts_free;
  if (take_ownership == 0) {
    pcVar5 = mime_subparts_unbind;
  }
  part->freefunc = pcVar5;
  part->arg = subparts;
  part->datasize = -1;
  part->kind = MIMEKIND_MULTIPART;
  return CURLE_OK;
}

Assistant:

CURLcode Curl_mime_set_subparts(curl_mimepart *part,
                                curl_mime *subparts, int take_ownership)
{
  curl_mime *root;

  if(!part)
    return CURLE_BAD_FUNCTION_ARGUMENT;

  /* Accept setting twice the same subparts. */
  if(part->kind == MIMEKIND_MULTIPART && part->arg == subparts)
    return CURLE_OK;

  cleanup_part_content(part);

  if(subparts) {
    /* Should not have been attached already. */
    if(subparts->parent)
      return CURLE_BAD_FUNCTION_ARGUMENT;

    /* Should not be the part's root. */
    root = part->parent;
    if(root) {
      while(root->parent && root->parent->parent)
        root = root->parent->parent;
      if(subparts == root) {
        /* cannot add as a subpart of itself. */
        return CURLE_BAD_FUNCTION_ARGUMENT;
      }
    }

    /* If subparts have already been used as a top-level MIMEPOST,
       they might not be positioned at start. Rewind them now, as
       a future check while rewinding the parent may cause this
       content to be skipped. */
    if(mime_subparts_seek(subparts, (curl_off_t) 0, SEEK_SET) !=
       CURL_SEEKFUNC_OK)
      return CURLE_SEND_FAIL_REWIND;

    subparts->parent = part;
    /* Subparts are processed internally: no read callback. */
    part->seekfunc = mime_subparts_seek;
    part->freefunc = take_ownership ? mime_subparts_free :
      mime_subparts_unbind;
    part->arg = subparts;
    part->datasize = -1;
    part->kind = MIMEKIND_MULTIPART;
  }

  return CURLE_OK;
}